

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O1

bool __thiscall svg::Document::save(Document *this)

{
  int iVar1;
  ofstream ofs;
  long local_218;
  filebuf local_210 [24];
  int aiStack_1f8 [54];
  ios_base local_120 [264];
  
  std::ofstream::ofstream(&local_218,(this->file_name)._M_dataplus._M_p,_S_out);
  iVar1 = *(int *)((long)aiStack_1f8 + *(long *)(local_218 + -0x18));
  if (iVar1 == 0) {
    writeToStream(this,(ostream *)&local_218);
    std::ofstream::close();
  }
  local_218 = _VTT;
  *(undefined8 *)(local_210 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_210);
  std::ios_base::~ios_base(local_120);
  return iVar1 == 0;
}

Assistant:

bool save() const
        {
            std::ofstream ofs(file_name.c_str());
            if (!ofs.good())
                return false;

            writeToStream(ofs);
            ofs.close();
            return true;
        }